

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  int iVar1;
  undefined1 local_44 [8];
  spng_chrm_int chrm_int;
  int ret;
  spng_chrm *chrm_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (chrm == (spng_chrm *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    unique0x100001c7 = chrm;
    chrm_int.blue_x = read_chunks(ctx,0);
    ctx_local._4_4_ = chrm_int.blue_x;
    if (chrm_int.blue_x == 0) {
      local_44._0_4_ = (undefined4)(long)(stack0xffffffffffffffe0->white_point_x * 100000.0);
      local_44._4_4_ = (undefined4)(long)(stack0xffffffffffffffe0->white_point_y * 100000.0);
      chrm_int.white_point_x = (uint32_t)(long)(stack0xffffffffffffffe0->red_x * 100000.0);
      chrm_int.white_point_y = (uint32_t)(long)(stack0xffffffffffffffe0->red_y * 100000.0);
      chrm_int.red_x = (uint32_t)(long)(stack0xffffffffffffffe0->green_x * 100000.0);
      chrm_int.red_y = (uint32_t)(long)(stack0xffffffffffffffe0->green_y * 100000.0);
      chrm_int.green_x = (uint32_t)(long)(stack0xffffffffffffffe0->blue_x * 100000.0);
      chrm_int.green_y = (uint32_t)(long)(stack0xffffffffffffffe0->blue_y * 100000.0);
      iVar1 = check_chrm_int((spng_chrm_int *)local_44);
      if (iVar1 == 0) {
        (ctx->chrm_int).white_point_x = local_44._0_4_;
        (ctx->chrm_int).white_point_y = local_44._4_4_;
        (ctx->chrm_int).red_x = chrm_int.white_point_x;
        (ctx->chrm_int).red_y = chrm_int.white_point_y;
        (ctx->chrm_int).green_x = chrm_int.red_x;
        (ctx->chrm_int).green_y = chrm_int.red_y;
        (ctx->chrm_int).blue_x = chrm_int.green_x;
        (ctx->chrm_int).blue_y = chrm_int.green_y;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffffffb | 4);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffffffb | 4);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0x22;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_SET_CHUNK_BOILERPLATE(chrm);

    struct spng_chrm_int chrm_int;

    chrm_int.white_point_x = (uint32_t)(chrm->white_point_x * 100000.0);
    chrm_int.white_point_y = (uint32_t)(chrm->white_point_y * 100000.0);
    chrm_int.red_x = (uint32_t)(chrm->red_x * 100000.0);
    chrm_int.red_y = (uint32_t)(chrm->red_y * 100000.0);
    chrm_int.green_x = (uint32_t)(chrm->green_x * 100000.0);
    chrm_int.green_y = (uint32_t)(chrm->green_y * 100000.0);
    chrm_int.blue_x = (uint32_t)(chrm->blue_x * 100000.0);
    chrm_int.blue_y = (uint32_t)(chrm->blue_y * 100000.0);

    if(check_chrm_int(&chrm_int)) return SPNG_ECHRM;

    ctx->chrm_int = chrm_int;

    ctx->stored.chrm = 1;
    ctx->user.chrm = 1;

    return 0;
}